

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_overshoot.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::prevent_coarsen_overshoot_tmp<3,1>
          (Omega_h *this,Mesh *mesh,Real max_length,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Alloc *pAVar1;
  Int IVar2;
  void *extraout_RDX;
  LO size_in;
  size_t sVar3;
  Read<signed_char> RVar4;
  allocator local_171;
  Write<signed_char> out;
  Write<int> local_158;
  Write<signed_char> local_148;
  Write<signed_char> local_138;
  LOs ev2v;
  MetricEdgeLengths<3,_3> measurer;
  type f;
  Adj v2e;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    MetricEdgeLengths<3,_1>::MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&measurer,mesh);
    Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
    Mesh::ask_up(&v2e,mesh,0,1);
    pAVar1 = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar3 = pAVar1->size;
    }
    else {
      sVar3 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&f,"",&local_171);
    size_in = (LO)(sVar3 >> 2);
    Write<signed_char>::Write(&out,size_in,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<int>::Write((Write<int> *)&f,&cands2edges->write_);
    Write<signed_char>::Write(&f.cand_codes.write_,&cand_codes->write_);
    Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
    Adj::Adj(&f.v2e,&v2e);
    MetricEdgeLengths<3,_1>::MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&f.measurer,&measurer);
    f.max_length = max_length;
    Write<signed_char>::Write(&f.out,&out);
    parallel_for<Omega_h::prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (size_in,&f,"prevent_coarsen_overshoot");
    Write<signed_char>::Write(&local_148,&out);
    Read<signed_char>::Read((Read<signed_char> *)&local_138,&local_148);
    Write<int>::Write(&local_158,&cands2edges->write_);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,(Int)mesh,(Read<signed_char> *)0x1,(LOs *)&local_138,(char)&local_158,0)
    ;
    Write<int>::~Write(&local_158);
    Write<signed_char>::~Write(&local_138);
    Write<signed_char>::~Write(&local_148);
    prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)
    ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
    Write<signed_char>::~Write(&out);
    Adj::~Adj(&v2e);
    Write<int>::~Write(&ev2v.write_);
    MetricEdgeLengths<3,_1>::~MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&measurer);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == mesh_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_overshoot.cpp"
       ,0xe);
}

Assistant:

Read<I8> prevent_coarsen_overshoot_tmp(
    Mesh* mesh, Real max_length, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricEdgeLengths<mesh_dim, metric_dim> measurer(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto ncands = cands2edges.size();
  auto out = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto ve = v2e.a2ab[v_col]; ve < v2e.a2ab[v_col + 1]; ++ve) {
        auto e2 = v2e.ab2b[ve];
        if (e2 == e) continue;
        auto e2_code = v2e.codes[ve];
        auto eev_in = code_which_down(e2_code);
        auto eev_out = 1 - eev_in;
        Few<LO, 2> new_edge;
        new_edge[eev_in] = v_onto;
        new_edge[eev_out] = ev2v[e2 * 2 + eev_out];
        auto length = measurer.measure(new_edge);
        if (length >= max_length) {
          code = dont_collapse(code, eev_col);
          break;
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_overshoot");
  return mesh->sync_subset_array(
      EDGE, Read<I8>(out), cands2edges, I8(DONT_COLLAPSE), 1);
}